

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O3

void __thiscall gui::DefaultTheme::DefaultTheme(DefaultTheme *this,Gui *gui,Font *font)

{
  float fVar1;
  
  Theme::Theme(&this->super_Theme,gui);
  (this->super_Theme)._vptr_Theme = (_func_int **)&PTR__DefaultTheme_0027b818;
  (this->font_)._M_t.super___uniq_ptr_impl<sf::Font,_void_(*)(sf::Font_*)>._M_t.
  super__Tuple_impl<0UL,_sf::Font_*,_void_(*)(sf::Font_*)>.
  super__Tuple_impl<1UL,_void_(*)(sf::Font_*)>.super__Head_base<1UL,_void_(*)(sf::Font_*),_false>.
  _M_head_impl = DefaultTheme(gui::Gui_const&,sf::Font&)::$_0::__invoke(sf::Font__;
  (this->font_)._M_t.super___uniq_ptr_impl<sf::Font,_void_(*)(sf::Font_*)>._M_t.
  super__Tuple_impl<0UL,_sf::Font_*,_void_(*)(sf::Font_*)>.super__Head_base<0UL,_sf::Font_*,_false>.
  _M_head_impl = font;
  fVar1 = Theme::computeTextMaxHeightRatio(&this->super_Theme,font);
  this->fontMaxHeightRatio_ = fVar1;
  return;
}

Assistant:

DefaultTheme::DefaultTheme(const Gui& gui, sf::Font& font) :
    Theme(gui),
    font_(&font, [](sf::Font* /*ptr*/) { /* Do nothing.*/ }) {

    fontMaxHeightRatio_ = computeTextMaxHeightRatio(*font_);
}